

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

StoreRegKind get_storage3(DisasContext_conflict1 *s,int rd,int rn,int *as)

{
  StoreRegKind local_2c;
  StoreRegKind ret;
  int *as_local;
  int rn_local;
  int rd_local;
  DisasContext_conflict1 *s_local;
  
  local_2c = STREG_NORMAL;
  if ((rd == 0xf) && (*as != 0)) {
    if ((s->user != 0) || (s->current_el == 2)) {
      unallocated_encoding_aarch64(s);
      return STREG_NORMAL;
    }
    *as = 0;
    local_2c = STREG_EXC_RET;
  }
  else if ((rd == 0xd) && (rn == 0xd)) {
    local_2c = STREG_SP_CHECK;
  }
  return local_2c;
}

Assistant:

static StoreRegKind get_storage3(DisasContext *s, int rd, int rn, int *as)
{
    StoreRegKind ret = STREG_NORMAL;
    if (rd == 15 && *as) {
        /*
         * See ALUExceptionReturn:
         * In User mode, UNPREDICTABLE; we choose UNDEF.
         * In Hyp mode, UNDEFINED.
         */
        if (IS_USER(s) || s->current_el == 2) {
            unallocated_encoding(s);
            return true;
        }
        /* There is no writeback of nzcv to PSTATE.  */
        *as = 0;
        ret = STREG_EXC_RET;
    } else if (rd == 13 && rn == 13) {
        ret = STREG_SP_CHECK;
    }

    return ret;
}